

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall UtilTest_ParseNonnegativeInt_Test::TestBody(UtilTest_ParseNonnegativeInt_Test *this)

{
  fmt::v5::print<char[37]>((char (*) [37])"Skipping parse_nonnegative_int test\n");
  return;
}

Assistant:

TEST(UtilTest, ParseNonnegativeInt) {
  if (std::numeric_limits<int>::max() !=
      static_cast<int>(static_cast<unsigned>(1) << 31)) {
    fmt::print("Skipping parse_nonnegative_int test\n");
    return;
  }
  fmt::string_view s = "10000000000";
  auto begin = s.begin(), end = s.end();
  EXPECT_THROW_MSG(
        parse_nonnegative_int(begin, end, fmt::internal::error_handler()),
        fmt::format_error, "number is too big");
  s = "2147483649";
  begin = s.begin();
  end = s.end();
  EXPECT_THROW_MSG(
        parse_nonnegative_int(begin, end, fmt::internal::error_handler()),
        fmt::format_error, "number is too big");
}